

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O3

void llvm::printEscapedString(StringRef Name,raw_ostream *Out)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  raw_ostream *prVar4;
  byte *in_RCX;
  raw_ostream *extraout_RDX;
  ulong uVar5;
  uchar UC;
  byte bVar6;
  raw_ostream *__buf;
  
  if ((int)Name.Length != 0) {
    uVar5 = 0;
    __buf = Out;
    do {
      if (Name.Length <= uVar5) {
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                      ,0xef,"char llvm::StringRef::operator[](size_t) const");
      }
      bVar1 = Name.Data[uVar5];
      prVar4 = Out;
      if ((((byte)(bVar1 - 0x20) < 0x5f) && (bVar1 != 0x22)) && (bVar1 != 0x5c)) {
        pbVar3 = (byte *)Out->OutBufCur;
        if (pbVar3 < Out->OutBufEnd) {
          in_RCX = pbVar3 + 1;
          Out->OutBufCur = (char *)in_RCX;
          *pbVar3 = bVar1;
        }
        else {
LAB_00164915:
          raw_ostream::write(prVar4,(uint)bVar1,__buf,(size_t)in_RCX);
          __buf = extraout_RDX;
        }
      }
      else {
        pcVar2 = Out->OutBufCur;
        if (pcVar2 < Out->OutBufEnd) {
          Out->OutBufCur = pcVar2 + 1;
          *pcVar2 = '\\';
        }
        else {
          prVar4 = (raw_ostream *)raw_ostream::write(Out,0x5c,__buf,(size_t)in_RCX);
        }
        bVar6 = (bVar1 >> 4) + 0x37;
        if (bVar1 < 0xa0) {
          bVar6 = (bVar1 >> 4) + 0x30;
        }
        pbVar3 = (byte *)prVar4->OutBufCur;
        if (pbVar3 < prVar4->OutBufEnd) {
          prVar4->OutBufCur = (char *)(pbVar3 + 1);
          *pbVar3 = bVar6;
        }
        else {
          prVar4 = (raw_ostream *)raw_ostream::write(prVar4,(uint)bVar6,pbVar3,(ulong)bVar6);
        }
        bVar6 = bVar1 & 0xf;
        bVar1 = bVar6 + 0x37;
        if (bVar6 < 10) {
          bVar1 = bVar6 + 0x30;
        }
        in_RCX = (byte *)(ulong)bVar1;
        __buf = (raw_ostream *)prVar4->OutBufCur;
        if ((raw_ostream *)prVar4->OutBufEnd <= __buf) goto LAB_00164915;
        prVar4->OutBufCur = (char *)((long)&__buf->_vptr_raw_ostream + 1);
        *(byte *)&__buf->_vptr_raw_ostream = bVar1;
      }
      uVar5 = uVar5 + 1;
    } while ((int)Name.Length != (int)uVar5);
  }
  return;
}

Assistant:

void llvm::printEscapedString(StringRef Name, raw_ostream &Out) {
  for (unsigned i = 0, e = Name.size(); i != e; ++i) {
    unsigned char C = Name[i];
    if (isPrint(C) && C != '\\' && C != '"')
      Out << C;
    else
      Out << '\\' << hexdigit(C >> 4) << hexdigit(C & 0x0F);
  }
}